

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint4_sse2.h
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occludedCoherent(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  AccelData *pAVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  uint uVar9;
  uint uVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  uint uVar34;
  undefined4 uVar35;
  ulong uVar36;
  uint uVar37;
  ulong *puVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong *puVar44;
  long lVar45;
  ulong uVar46;
  ulong uVar47;
  bool bVar48;
  bool bVar49;
  undefined1 auVar50 [16];
  uint uVar51;
  uint uVar52;
  uint uVar68;
  vint4 ai;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  uint uVar69;
  uint uVar70;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  vint4 ai_1;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  vint4 ai_3;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  vint4 bi;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar89 [64];
  vint4 bi_1;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  vint4 bi_3;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  vint4 ai_2;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  float fVar101;
  vint4 bi_2;
  undefined1 auVar99 [16];
  float fVar102;
  undefined1 auVar100 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  vint<4> octant;
  StackItemMaskT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_27a8 [16];
  undefined1 local_2798 [16];
  float local_2708;
  float fStack_2704;
  float fStack_2700;
  float fStack_26fc;
  undefined1 local_26f8 [16];
  undefined1 local_26e8 [16];
  anon_union_16_2_9473010e_for_vint_impl<4>_1 local_26d8;
  undefined8 local_26c8;
  undefined8 uStack_26c0;
  undefined8 local_26b8;
  undefined8 uStack_26b0;
  undefined4 local_26a8;
  undefined4 uStack_26a4;
  undefined4 uStack_26a0;
  undefined4 uStack_269c;
  undefined1 local_2698 [16];
  float local_2688;
  float fStack_2684;
  float fStack_2680;
  float fStack_267c;
  float local_2678;
  float fStack_2674;
  float fStack_2670;
  float fStack_266c;
  float local_2668;
  float fStack_2664;
  float fStack_2660;
  float fStack_265c;
  undefined1 local_2658 [16];
  undefined1 local_2648 [16];
  undefined4 local_2638;
  undefined4 uStack_2634;
  undefined4 uStack_2630;
  undefined4 uStack_262c;
  undefined1 local_2628 [16];
  undefined1 local_2618 [16];
  undefined1 local_2608 [16];
  undefined1 local_25f8 [16];
  undefined8 local_25e8;
  undefined8 uStack_25e0;
  undefined8 local_25d8;
  undefined8 uStack_25d0;
  undefined8 local_25c8;
  undefined8 uStack_25c0;
  undefined8 local_25b8;
  undefined8 uStack_25b0;
  undefined8 local_25a8;
  undefined8 uStack_25a0;
  undefined8 local_2598;
  undefined8 uStack_2590;
  undefined1 local_2588 [16];
  undefined1 local_2578 [16];
  undefined1 local_2568 [16];
  undefined1 local_2558 [32];
  undefined8 local_2538;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  undefined8 uStack_2520;
  float local_2518;
  float fStack_2514;
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  float fStack_2504;
  float fStack_2500;
  float fStack_24fc;
  float local_24f8;
  float fStack_24f4;
  float fStack_24f0;
  float fStack_24ec;
  float fStack_24e8;
  float fStack_24e4;
  float fStack_24e0;
  float fStack_24dc;
  undefined4 local_24d8;
  undefined4 uStack_24d4;
  undefined4 uStack_24d0;
  undefined4 uStack_24cc;
  undefined4 uStack_24c8;
  undefined4 uStack_24c4;
  undefined4 uStack_24c0;
  undefined4 uStack_24bc;
  undefined4 local_24b8;
  undefined4 uStack_24b4;
  undefined4 uStack_24b0;
  undefined4 uStack_24ac;
  undefined4 uStack_24a8;
  undefined4 uStack_24a4;
  undefined4 uStack_24a0;
  undefined4 uStack_249c;
  undefined4 local_2498;
  undefined4 uStack_2494;
  undefined4 uStack_2490;
  undefined4 uStack_248c;
  undefined4 uStack_2488;
  undefined4 uStack_2484;
  undefined4 uStack_2480;
  undefined4 uStack_247c;
  uint local_2478;
  uint uStack_2474;
  uint uStack_2470;
  uint uStack_246c;
  uint uStack_2468;
  uint uStack_2464;
  uint uStack_2460;
  uint uStack_245c;
  undefined8 local_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined8 uStack_2440;
  uint local_2438;
  uint uStack_2434;
  uint uStack_2430;
  uint uStack_242c;
  uint uStack_2428;
  uint uStack_2424;
  uint uStack_2420;
  uint uStack_241c;
  undefined8 local_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  undefined8 uStack_2400;
  float local_23f8;
  float fStack_23f4;
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  float fStack_23e4;
  float fStack_23e0;
  float fStack_23dc;
  float local_23d8;
  float fStack_23d4;
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  float fStack_23c4;
  float fStack_23c0;
  float fStack_23bc;
  uint local_23b8;
  uint uStack_23b4;
  uint uStack_23b0;
  uint uStack_23ac;
  uint uStack_23a8;
  uint uStack_23a4;
  uint uStack_23a0;
  uint uStack_239c;
  undefined1 local_2398 [32];
  ulong local_2378 [1127];
  vint4 bi_8;
  
  local_26d8 = valid_i->field_0;
  auVar50 = vpcmpeqd_avx(in_ZMM5._0_16_,in_ZMM5._0_16_);
  auVar103 = vpcmpeqd_avx((undefined1  [16])local_26d8,auVar50);
  uVar34 = vmovmskps_avx(auVar103);
  if (uVar34 == 0) {
    return;
  }
  pAVar5 = This->ptr;
  uVar41 = (ulong)(uVar34 & 0xff);
  auVar31 = *(undefined1 (*) [16])ray;
  local_2678 = *(float *)(ray + 0x10);
  auVar32 = *(undefined1 (*) [16])(ray + 0x10);
  local_2688 = *(float *)(ray + 0x20);
  auVar33 = *(undefined1 (*) [16])(ray + 0x20);
  local_26e8._8_4_ = 0x7fffffff;
  local_26e8._0_8_ = 0x7fffffff7fffffff;
  local_26e8._12_4_ = 0x7fffffff;
  auVar104 = *(undefined1 (*) [16])(ray + 0x40);
  auVar53 = vandps_avx(local_26e8,auVar104);
  auVar77._8_4_ = 0x219392ef;
  auVar77._0_8_ = 0x219392ef219392ef;
  auVar77._12_4_ = 0x219392ef;
  auVar53 = vcmpps_avx(auVar53,auVar77,1);
  auVar67 = vblendvps_avx(auVar104,auVar77,auVar53);
  auVar53 = vandps_avx(local_26e8,*(undefined1 (*) [16])(ray + 0x50));
  auVar53 = vcmpps_avx(auVar53,auVar77,1);
  auVar6 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar77,auVar53);
  auVar53 = vandps_avx(local_26e8,*(undefined1 (*) [16])(ray + 0x60));
  auVar53 = vcmpps_avx(auVar53,auVar77,1);
  auVar53 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar77,auVar53);
  auVar77 = vrcpps_avx(auVar67);
  auVar82._8_4_ = 0x3f800000;
  auVar82._0_8_ = &DAT_3f8000003f800000;
  auVar82._12_4_ = 0x3f800000;
  auVar67 = vfnmadd213ps_fma(auVar67,auVar77,auVar82);
  auVar77 = vfmadd132ps_fma(auVar67,auVar77,auVar77);
  auVar67 = vrcpps_avx(auVar6);
  auVar6 = vfnmadd213ps_fma(auVar6,auVar67,auVar82);
  auVar6 = vfmadd132ps_fma(auVar6,auVar67,auVar67);
  auVar67 = vrcpps_avx(auVar53);
  auVar53 = vfnmadd213ps_fma(auVar53,auVar67,auVar82);
  auVar82 = vfmadd132ps_fma(auVar53,auVar67,auVar67);
  auVar71 = ZEXT816(0);
  auVar67 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar71);
  local_2698 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar71);
  auVar89 = ZEXT1664(auVar103 ^ auVar50);
  auVar104 = vcmpps_avx(auVar104,auVar71,1);
  auVar53._8_4_ = 1;
  auVar53._0_8_ = 0x100000001;
  auVar53._12_4_ = 1;
  auVar104 = vandps_avx(auVar104,auVar53);
  auVar53 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar71,1);
  auVar78._8_4_ = 2;
  auVar78._0_8_ = 0x200000002;
  auVar78._12_4_ = 2;
  auVar53 = vandps_avx(auVar53,auVar78);
  auVar53 = vorps_avx(auVar53,auVar104);
  auVar104 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar71,1);
  auVar71._8_4_ = 4;
  auVar71._0_8_ = 0x400000004;
  auVar71._12_4_ = 4;
  auVar104 = vandps_avx(auVar104,auVar71);
  auVar50 = vpor_avx(auVar103 ^ auVar50,auVar104);
  local_26f8 = vpor_avx(auVar50,auVar53);
  local_2668 = *(float *)ray;
  fStack_2664 = *(float *)(ray + 4);
  fStack_2660 = *(float *)(ray + 8);
  fStack_265c = *(float *)(ray + 0xc);
  auVar103._0_4_ = auVar77._0_4_ * -*(float *)ray;
  auVar103._4_4_ = auVar77._4_4_ * -*(float *)(ray + 4);
  auVar103._8_4_ = auVar77._8_4_ * -*(float *)(ray + 8);
  auVar103._12_4_ = auVar77._12_4_ * -*(float *)(ray + 0xc);
  fStack_2674 = *(float *)(ray + 0x14);
  fStack_2670 = *(float *)(ray + 0x18);
  fStack_266c = *(float *)(ray + 0x1c);
  auVar104._0_4_ = auVar6._0_4_ * -local_2678;
  auVar104._4_4_ = auVar6._4_4_ * -*(float *)(ray + 0x14);
  auVar104._8_4_ = auVar6._8_4_ * -*(float *)(ray + 0x18);
  auVar104._12_4_ = auVar6._12_4_ * -*(float *)(ray + 0x1c);
  fStack_2684 = *(float *)(ray + 0x24);
  fStack_2680 = *(float *)(ray + 0x28);
  fStack_267c = *(float *)(ray + 0x2c);
  local_2638 = 0x80000000;
  uStack_2634 = 0x80000000;
  uStack_2630 = 0x80000000;
  uStack_262c = 0x80000000;
  auVar50._0_4_ = auVar82._0_4_ * -local_2688;
  auVar50._4_4_ = auVar82._4_4_ * -*(float *)(ray + 0x24);
  auVar50._8_4_ = auVar82._8_4_ * -*(float *)(ray + 0x28);
  auVar50._12_4_ = auVar82._12_4_ * -*(float *)(ray + 0x2c);
  local_24d8 = 0x80000000;
  uStack_24d4 = 0x80000000;
  uStack_24d0 = 0x80000000;
  uStack_24cc = 0x80000000;
  uStack_24c8 = 0x80000000;
  uStack_24c4 = 0x80000000;
  uStack_24c0 = 0x80000000;
  uStack_24bc = 0x80000000;
  local_26a8 = 0x7f800000;
  uStack_26a4 = 0x7f800000;
  uStack_26a0 = 0x7f800000;
  uStack_269c = 0x7f800000;
LAB_006433a2:
  lVar45 = 0;
  for (uVar40 = uVar41; (uVar40 & 1) == 0; uVar40 = uVar40 >> 1 | 0x8000000000000000) {
    lVar45 = lVar45 + 1;
  }
  uVar35 = *(undefined4 *)(local_26f8 + lVar45 * 4);
  auVar54._4_4_ = uVar35;
  auVar54._0_4_ = uVar35;
  auVar54._8_4_ = uVar35;
  auVar54._12_4_ = uVar35;
  local_27a8 = vpcmpeqd_avx(auVar54,local_26f8);
  uVar35 = vmovmskps_avx(local_27a8);
  local_2378[1] = CONCAT44((int)((ulong)lVar45 >> 0x20),uVar35);
  auVar83._8_4_ = 0x7f800000;
  auVar83._0_8_ = 0x7f8000007f800000;
  auVar83._12_4_ = 0x7f800000;
  auVar53 = vblendvps_avx(auVar83,auVar77,local_27a8);
  uVar41 = ~local_2378[1] & uVar41;
  auVar71 = vshufps_avx(auVar53,auVar53,0xb1);
  auVar53 = vminps_avx(auVar71,auVar53);
  auVar71 = vshufpd_avx(auVar53,auVar53,1);
  auVar71 = vminps_avx(auVar71,auVar53);
  auVar53 = vblendvps_avx(auVar83,auVar6,local_27a8);
  auVar78 = vshufps_avx(auVar53,auVar53,0xb1);
  auVar53 = vminps_avx(auVar78,auVar53);
  auVar78 = vshufpd_avx(auVar53,auVar53,1);
  auVar53 = vminps_avx(auVar78,auVar53);
  auVar71 = vinsertps_avx(auVar71,auVar53,0x1c);
  auVar53 = vblendvps_avx(auVar83,auVar82,local_27a8);
  auVar78 = vshufps_avx(auVar53,auVar53,0xb1);
  auVar53 = vminps_avx(auVar78,auVar53);
  auVar78 = vshufpd_avx(auVar53,auVar53,1);
  auVar78 = vminps_avx(auVar78,auVar53);
  auVar90._8_4_ = 0xff800000;
  auVar90._0_8_ = 0xff800000ff800000;
  auVar90._12_4_ = 0xff800000;
  auVar53 = vblendvps_avx(auVar90,auVar77,local_27a8);
  auVar56 = vinsertps_avx(auVar71,auVar78,0x20);
  auVar71 = vshufps_avx(auVar53,auVar53,0xb1);
  auVar53 = vmaxps_avx(auVar71,auVar53);
  auVar71 = vshufpd_avx(auVar53,auVar53,1);
  auVar71 = vmaxps_avx(auVar71,auVar53);
  auVar53 = vblendvps_avx(auVar90,auVar6,local_27a8);
  auVar78 = vshufps_avx(auVar53,auVar53,0xb1);
  auVar53 = vmaxps_avx(auVar78,auVar53);
  auVar78 = vshufpd_avx(auVar53,auVar53,1);
  auVar53 = vmaxps_avx(auVar78,auVar53);
  auVar71 = vinsertps_avx(auVar71,auVar53,0x1c);
  auVar53 = vblendvps_avx(auVar90,auVar82,local_27a8);
  auVar78 = vshufps_avx(auVar53,auVar53,0xb1);
  auVar53 = vmaxps_avx(auVar78,auVar53);
  auVar78 = vshufpd_avx(auVar53,auVar53,1);
  auVar53 = vmaxps_avx(auVar78,auVar53);
  auVar84 = vinsertps_avx(auVar71,auVar53,0x20);
  auVar85 = vcmpps_avx(auVar56,ZEXT816(0) << 0x20,5);
  auVar53 = vblendvps_avx(auVar84,auVar56,auVar85);
  auVar71 = vmovshdup_avx(auVar53);
  local_2538 = auVar71._0_8_;
  uVar40 = (ulong)(auVar71._0_4_ < 0.0) << 5 | 0x40;
  auVar71 = vshufpd_avx(auVar53,auVar53,1);
  uVar47 = (ulong)(auVar71._0_4_ < 0.0) << 5 | 0x80;
  local_24f8 = auVar53._0_4_;
  auVar71 = vblendvps_avx(auVar83,auVar31,local_27a8);
  auVar78 = vshufps_avx(auVar71,auVar71,0xb1);
  auVar71 = vminps_avx(auVar78,auVar71);
  auVar78 = vshufpd_avx(auVar71,auVar71,1);
  auVar78 = vminps_avx(auVar78,auVar71);
  auVar71 = vblendvps_avx(auVar83,auVar32,local_27a8);
  auVar54 = vshufps_avx(auVar71,auVar71,0xb1);
  auVar71 = vminps_avx(auVar54,auVar71);
  auVar54 = vshufpd_avx(auVar71,auVar71,1);
  auVar54 = vminps_avx(auVar54,auVar71);
  auVar71 = vblendvps_avx(auVar83,auVar33,local_27a8);
  auVar78 = vinsertps_avx(auVar78,auVar54,0x1c);
  auVar54 = vshufps_avx(auVar71,auVar71,0xb1);
  auVar71 = vminps_avx(auVar54,auVar71);
  auVar54 = vshufpd_avx(auVar71,auVar71,1);
  auVar71 = vminps_avx(auVar54,auVar71);
  auVar78 = vinsertps_avx(auVar78,auVar71,0x20);
  auVar71 = vblendvps_avx(auVar90,auVar31,local_27a8);
  auVar54 = vshufps_avx(auVar71,auVar71,0xb1);
  auVar71 = vmaxps_avx(auVar54,auVar71);
  auVar54 = vshufpd_avx(auVar71,auVar71,1);
  auVar54 = vmaxps_avx(auVar54,auVar71);
  auVar71 = vblendvps_avx(auVar90,auVar32,local_27a8);
  auVar83 = vshufps_avx(auVar71,auVar71,0xb1);
  auVar71 = vmaxps_avx(auVar83,auVar71);
  auVar83 = vshufpd_avx(auVar71,auVar71,1);
  auVar83 = vmaxps_avx(auVar83,auVar71);
  auVar71 = vblendvps_avx(auVar90,auVar33,local_27a8);
  auVar54 = vinsertps_avx(auVar54,auVar83,0x1c);
  auVar83 = vshufps_avx(auVar71,auVar71,0xb1);
  auVar71 = vmaxps_avx(auVar83,auVar71);
  auVar83 = vshufpd_avx(auVar71,auVar71,1);
  auVar71 = vmaxps_avx(auVar83,auVar71);
  auVar54 = vinsertps_avx(auVar54,auVar71,0x20);
  auVar71 = vblendvps_avx(auVar54,auVar78,auVar85);
  auVar78 = vblendvps_avx(auVar78,auVar54,auVar85);
  local_2798 = vblendvps_avx(auVar90,local_2698,local_27a8);
  auVar54 = vshufps_avx(local_2798,local_2798,0xb1);
  auVar83 = vmaxps_avx(auVar54,local_2798);
  auVar55._8_4_ = 0x7f800000;
  auVar55._0_8_ = 0x7f8000007f800000;
  auVar55._12_4_ = 0x7f800000;
  auVar54 = vblendvps_avx(auVar55,auVar67,local_27a8);
  auVar90 = vshufpd_avx(auVar83,auVar83,1);
  auVar55 = vshufps_avx(auVar54,auVar54,0xb1);
  auVar54 = vminps_avx(auVar55,auVar54);
  auVar55 = vshufpd_avx(auVar54,auVar54,1);
  auVar55 = vminps_avx(auVar55,auVar54);
  auVar83 = vmaxps_avx(auVar90,auVar83);
  auVar54 = vblendvps_avx(auVar56,auVar84,auVar85);
  auVar56._0_4_ = auVar78._0_4_ * local_24f8;
  auVar56._4_4_ = auVar78._4_4_ * auVar53._4_4_;
  auVar56._8_4_ = auVar78._8_4_ * auVar53._8_4_;
  auVar56._12_4_ = auVar78._12_4_ * auVar53._12_4_;
  local_23d8 = auVar54._0_4_;
  auVar84._0_4_ = auVar71._0_4_ * local_23d8;
  auVar84._4_4_ = auVar71._4_4_ * auVar54._4_4_;
  auVar84._8_4_ = auVar71._8_4_ * auVar54._8_4_;
  auVar84._12_4_ = auVar71._12_4_ * auVar54._12_4_;
  uVar46 = (ulong)(local_24f8 < 0.0) * 0x20;
  local_2378[0] = *(ulong *)&pAVar5[1].bounds.bounds0.lower.field_0;
  fStack_24f4 = local_24f8;
  fStack_24f0 = local_24f8;
  fStack_24ec = local_24f8;
  fStack_24e8 = local_24f8;
  fStack_24e4 = local_24f8;
  fStack_24e0 = local_24f8;
  fStack_24dc = local_24f8;
  local_2518 = -auVar56._0_4_;
  fStack_2514 = -auVar56._0_4_;
  fStack_2510 = -auVar56._0_4_;
  fStack_250c = -auVar56._0_4_;
  fStack_2508 = -auVar56._0_4_;
  fStack_2504 = -auVar56._0_4_;
  fStack_2500 = -auVar56._0_4_;
  fStack_24fc = -auVar56._0_4_;
  uStack_2530 = local_2538;
  uStack_2528 = local_2538;
  uStack_2520 = local_2538;
  auVar71 = vmovshdup_avx(auVar56);
  uVar34 = auVar71._0_4_;
  uVar51 = auVar71._4_4_;
  local_2398._0_8_ = auVar71._0_8_ ^ 0x8000000080000000;
  local_2398._8_4_ = uVar34 ^ 0x80000000;
  local_2398._12_4_ = uVar51 ^ 0x80000000;
  local_2398._16_4_ = uVar34 ^ 0x80000000;
  local_2398._20_4_ = uVar51 ^ 0x80000000;
  local_2398._24_4_ = uVar34 ^ 0x80000000;
  local_2398._28_4_ = uVar51 ^ 0x80000000;
  auVar53 = vshufps_avx(auVar53,auVar53,0xaa);
  local_2558._0_8_ = auVar53._0_8_;
  local_2558._8_8_ = local_2558._0_8_;
  local_2558._16_8_ = local_2558._0_8_;
  local_2558._24_8_ = local_2558._0_8_;
  auVar78 = vshufps_avx(auVar56,auVar56,0xaa);
  uVar34 = auVar78._0_4_;
  uVar68 = auVar78._4_4_;
  local_23b8 = uVar34 ^ 0x80000000;
  uStack_23b4 = uVar68 ^ 0x80000000;
  uStack_23b0 = uVar34 ^ 0x80000000;
  uStack_23ac = uVar68 ^ 0x80000000;
  uStack_23a8 = uVar34 ^ 0x80000000;
  uStack_23a4 = uVar68 ^ 0x80000000;
  uStack_23a0 = uVar34 ^ 0x80000000;
  uStack_239c = uVar68 ^ 0x80000000;
  fStack_23d4 = local_23d8;
  fStack_23d0 = local_23d8;
  fStack_23cc = local_23d8;
  fStack_23c8 = local_23d8;
  fStack_23c4 = local_23d8;
  fStack_23c0 = local_23d8;
  fStack_23bc = local_23d8;
  local_23f8 = -auVar84._0_4_;
  fStack_23f4 = -auVar84._0_4_;
  fStack_23f0 = -auVar84._0_4_;
  fStack_23ec = -auVar84._0_4_;
  fStack_23e8 = -auVar84._0_4_;
  fStack_23e4 = -auVar84._0_4_;
  fStack_23e0 = -auVar84._0_4_;
  fStack_23dc = -auVar84._0_4_;
  auVar53 = vmovshdup_avx(auVar54);
  local_2418 = auVar53._0_8_;
  uStack_2410 = local_2418;
  uStack_2408 = local_2418;
  uStack_2400 = local_2418;
  auVar71 = vmovshdup_avx(auVar84);
  uVar51 = auVar71._0_4_;
  uVar69 = auVar71._4_4_;
  local_2438 = uVar51 ^ 0x80000000;
  uStack_2434 = uVar69 ^ 0x80000000;
  uStack_2430 = uVar51 ^ 0x80000000;
  uStack_242c = uVar69 ^ 0x80000000;
  uStack_2428 = uVar51 ^ 0x80000000;
  uStack_2424 = uVar69 ^ 0x80000000;
  uStack_2420 = uVar51 ^ 0x80000000;
  uStack_241c = uVar69 ^ 0x80000000;
  auVar53 = vshufps_avx(auVar54,auVar54,0xaa);
  local_2458 = auVar53._0_8_;
  uStack_2450 = local_2458;
  uStack_2448 = local_2458;
  uStack_2440 = local_2458;
  auVar54 = vshufps_avx(auVar84,auVar84,0xaa);
  auVar89 = ZEXT1664(auVar89._0_16_);
  uVar52 = auVar54._0_4_;
  uVar70 = auVar54._4_4_;
  local_2478 = uVar52 ^ 0x80000000;
  uStack_2474 = uVar70 ^ 0x80000000;
  uStack_2470 = uVar52 ^ 0x80000000;
  uStack_246c = uVar70 ^ 0x80000000;
  uStack_2468 = uVar52 ^ 0x80000000;
  uStack_2464 = uVar70 ^ 0x80000000;
  uStack_2460 = uVar52 ^ 0x80000000;
  uStack_245c = uVar70 ^ 0x80000000;
  local_2498 = auVar55._0_4_;
  uStack_2494 = local_2498;
  uStack_2490 = local_2498;
  uStack_248c = local_2498;
  uStack_2488 = local_2498;
  uStack_2484 = local_2498;
  uStack_2480 = local_2498;
  uStack_247c = local_2498;
  local_24b8 = auVar83._0_4_;
  uStack_24b4 = local_24b8;
  uStack_24b0 = local_24b8;
  uStack_24ac = local_24b8;
  uStack_24a8 = local_24b8;
  uStack_24a4 = local_24b8;
  uStack_24a0 = local_24b8;
  uStack_249c = local_24b8;
  puVar38 = local_2378 + 2;
  auVar85._8_4_ = 0x7f800000;
  auVar85._0_8_ = 0x7f8000007f800000;
  auVar85._12_4_ = 0x7f800000;
  auVar53 = vblendvps_avx(auVar85,auVar67,local_27a8);
LAB_006437c0:
  if (puVar38 != local_2378) {
    puVar44 = puVar38 + -2;
    auVar85 = auVar89._0_16_;
    uVar35 = vmovmskps_avx(auVar85);
    uVar36 = ~CONCAT44((int)((ulong)local_2378 >> 0x20),uVar35) & puVar38[-1];
    if (uVar36 != 0) {
      uVar43 = *puVar44;
      do {
        auVar66 = auVar89._0_16_;
        if ((uVar43 & 8) != 0) {
          if (uVar36 != 0) {
            uVar36 = (ulong)((uint)uVar43 & 0xf);
            auVar83 = auVar66;
            if (uVar36 == 8) goto LAB_00643df6;
            auVar73._0_8_ = auVar89._0_8_ ^ 0xffffffffffffffff;
            auVar73._8_4_ = auVar89._8_4_ ^ 0xffffffff;
            auVar73._12_4_ = auVar89._12_4_ ^ 0xffffffff;
            local_2598 = *(undefined8 *)ray;
            uStack_2590 = *(undefined8 *)(ray + 8);
            local_25a8 = *(undefined8 *)(ray + 0x10);
            uStack_25a0 = *(undefined8 *)(ray + 0x18);
            local_25b8 = *(undefined8 *)(ray + 0x20);
            uStack_25b0 = *(undefined8 *)(ray + 0x28);
            uVar18 = *(undefined8 *)(ray + 0x30);
            uVar19 = *(undefined8 *)(ray + 0x38);
            local_26b8 = uVar18;
            uStack_26b0 = uVar19;
            uVar20 = *(undefined8 *)(ray + 0x50);
            local_2708 = (float)uVar20;
            fStack_2704 = (float)((ulong)uVar20 >> 0x20);
            fStack_2700 = (float)*(undefined8 *)(ray + 0x58);
            fStack_26fc = (float)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20);
            local_25c8 = *(undefined8 *)(ray + 0x60);
            uStack_25c0 = *(undefined8 *)(ray + 0x68);
            local_25d8 = *(undefined8 *)(ray + 0x40);
            uStack_25d0 = *(undefined8 *)(ray + 0x48);
            auVar55 = *(undefined1 (*) [16])(ray + 0x40);
            uVar20 = *(undefined8 *)(ray + 0x80);
            uVar21 = *(undefined8 *)(ray + 0x88);
            local_26c8 = uVar20;
            uStack_26c0 = uVar21;
            local_25e8 = *(undefined8 *)(ray + 0x90);
            uStack_25e0 = *(undefined8 *)(ray + 0x98);
            lVar45 = (uVar43 & 0xfffffffffffffff0) + 0x90;
            uVar43 = 0;
            goto LAB_00643a96;
          }
          break;
        }
        uVar42 = CONCAT44(auVar56._0_4_,auVar56._0_4_);
        auVar12._8_4_ = -auVar56._0_4_;
        auVar12._0_8_ = uVar42 ^ 0x8000000080000000;
        auVar12._12_4_ = -auVar56._0_4_;
        auVar12._16_4_ = -auVar56._0_4_;
        auVar12._20_4_ = -auVar56._0_4_;
        auVar12._24_4_ = -auVar56._0_4_;
        auVar12._28_4_ = -auVar56._0_4_;
        auVar13._4_4_ = local_24f8;
        auVar13._0_4_ = local_24f8;
        auVar13._8_4_ = local_24f8;
        auVar13._12_4_ = local_24f8;
        auVar13._16_4_ = local_24f8;
        auVar13._20_4_ = local_24f8;
        auVar13._24_4_ = local_24f8;
        auVar13._28_4_ = local_24f8;
        auVar83 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar43 + 0x40 + uVar46),auVar12,auVar13);
        auVar11._8_8_ = local_2538;
        auVar11._0_8_ = local_2538;
        auVar11._16_8_ = local_2538;
        auVar11._24_8_ = local_2538;
        auVar55 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar43 + 0x40 + uVar40),local_2398,auVar11)
        ;
        auVar11 = vpmaxsd_avx2(ZEXT1632(auVar83),ZEXT1632(auVar55));
        auVar30._8_4_ = uVar34 ^ 0x80000000;
        auVar30._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
        auVar30._12_4_ = uVar68 ^ 0x80000000;
        auVar30._16_4_ = uVar34 ^ 0x80000000;
        auVar30._20_4_ = uVar68 ^ 0x80000000;
        auVar30._24_4_ = uVar34 ^ 0x80000000;
        auVar30._28_4_ = uVar68 ^ 0x80000000;
        auVar83 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar43 + 0x40 + uVar47),auVar30,local_2558)
        ;
        auVar23._4_4_ = local_2498;
        auVar23._0_4_ = local_2498;
        auVar23._8_4_ = local_2498;
        auVar23._12_4_ = local_2498;
        auVar23._16_4_ = local_2498;
        auVar23._20_4_ = local_2498;
        auVar23._24_4_ = local_2498;
        auVar23._28_4_ = local_2498;
        auVar12 = vpmaxsd_avx2(ZEXT1632(auVar83),auVar23);
        auVar11 = vpmaxsd_avx2(auVar11,auVar12);
        uVar42 = CONCAT44(auVar84._0_4_,auVar84._0_4_);
        auVar28._8_4_ = -auVar84._0_4_;
        auVar28._0_8_ = uVar42 ^ 0x8000000080000000;
        auVar28._12_4_ = -auVar84._0_4_;
        auVar28._16_4_ = -auVar84._0_4_;
        auVar28._20_4_ = -auVar84._0_4_;
        auVar28._24_4_ = -auVar84._0_4_;
        auVar28._28_4_ = -auVar84._0_4_;
        auVar29._4_4_ = local_23d8;
        auVar29._0_4_ = local_23d8;
        auVar29._8_4_ = local_23d8;
        auVar29._12_4_ = local_23d8;
        auVar29._16_4_ = local_23d8;
        auVar29._20_4_ = local_23d8;
        auVar29._24_4_ = local_23d8;
        auVar29._28_4_ = local_23d8;
        auVar83 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar43 + 0x40 + (uVar46 ^ 0x20)),auVar28,
                                  auVar29);
        auVar26._8_4_ = uVar51 ^ 0x80000000;
        auVar26._0_8_ = auVar71._0_8_ ^ 0x8000000080000000;
        auVar26._12_4_ = uVar69 ^ 0x80000000;
        auVar26._16_4_ = uVar51 ^ 0x80000000;
        auVar26._20_4_ = uVar69 ^ 0x80000000;
        auVar26._24_4_ = uVar51 ^ 0x80000000;
        auVar26._28_4_ = uVar69 ^ 0x80000000;
        auVar27._8_8_ = local_2418;
        auVar27._0_8_ = local_2418;
        auVar27._16_8_ = local_2418;
        auVar27._24_8_ = local_2418;
        auVar55 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar43 + 0x40 + (uVar40 ^ 0x20)),auVar26,
                                  auVar27);
        auVar12 = vpminsd_avx2(ZEXT1632(auVar83),ZEXT1632(auVar55));
        auVar24._8_4_ = uVar52 ^ 0x80000000;
        auVar24._0_8_ = auVar54._0_8_ ^ 0x8000000080000000;
        auVar24._12_4_ = uVar70 ^ 0x80000000;
        auVar24._16_4_ = uVar52 ^ 0x80000000;
        auVar24._20_4_ = uVar70 ^ 0x80000000;
        auVar24._24_4_ = uVar52 ^ 0x80000000;
        auVar24._28_4_ = uVar70 ^ 0x80000000;
        auVar25._8_8_ = local_2458;
        auVar25._0_8_ = local_2458;
        auVar25._16_8_ = local_2458;
        auVar25._24_8_ = local_2458;
        auVar83 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar43 + 0x40 + (uVar47 ^ 0x20)),auVar24,
                                  auVar25);
        auVar22._4_4_ = local_24b8;
        auVar22._0_4_ = local_24b8;
        auVar22._8_4_ = local_24b8;
        auVar22._12_4_ = local_24b8;
        auVar22._16_4_ = local_24b8;
        auVar22._20_4_ = local_24b8;
        auVar22._24_4_ = local_24b8;
        auVar22._28_4_ = local_24b8;
        auVar13 = vpminsd_avx2(ZEXT1632(auVar83),auVar22);
        auVar12 = vpminsd_avx2(auVar12,auVar13);
        auVar11 = vcmpps_avx(auVar11,auVar12,2);
        uVar37 = vmovmskps_avx(auVar11);
        if (uVar37 == 0) {
          bVar49 = false;
        }
        else {
          uVar39 = (ulong)(uVar37 & 0xff);
          uVar42 = 8;
          uVar36 = 0;
          do {
            lVar45 = 0;
            for (uVar14 = uVar39; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
              lVar45 = lVar45 + 1;
            }
            uVar35 = *(undefined4 *)(uVar43 + 0x40 + lVar45 * 4);
            auVar57._4_4_ = uVar35;
            auVar57._0_4_ = uVar35;
            auVar57._8_4_ = uVar35;
            auVar57._12_4_ = uVar35;
            auVar90 = vfmadd213ps_fma(auVar57,auVar77,auVar103);
            uVar35 = *(undefined4 *)(uVar43 + 0x80 + lVar45 * 4);
            auVar72._4_4_ = uVar35;
            auVar72._0_4_ = uVar35;
            auVar72._8_4_ = uVar35;
            auVar72._12_4_ = uVar35;
            auVar66 = vfmadd213ps_fma(auVar72,auVar6,auVar104);
            uVar35 = *(undefined4 *)(uVar43 + 0xc0 + lVar45 * 4);
            auVar79._4_4_ = uVar35;
            auVar79._0_4_ = uVar35;
            auVar79._8_4_ = uVar35;
            auVar79._12_4_ = uVar35;
            auVar73 = vfmadd213ps_fma(auVar79,auVar82,auVar50);
            uVar35 = *(undefined4 *)(uVar43 + 0x60 + lVar45 * 4);
            auVar86._4_4_ = uVar35;
            auVar86._0_4_ = uVar35;
            auVar86._8_4_ = uVar35;
            auVar86._12_4_ = uVar35;
            auVar88 = vfmadd213ps_fma(auVar86,auVar77,auVar103);
            uVar35 = *(undefined4 *)(uVar43 + 0xa0 + lVar45 * 4);
            auVar91._4_4_ = uVar35;
            auVar91._0_4_ = uVar35;
            auVar91._8_4_ = uVar35;
            auVar91._12_4_ = uVar35;
            auVar58 = vfmadd213ps_fma(auVar91,auVar6,auVar104);
            uVar35 = *(undefined4 *)(uVar43 + 0xe0 + lVar45 * 4);
            auVar95._4_4_ = uVar35;
            auVar95._0_4_ = uVar35;
            auVar95._8_4_ = uVar35;
            auVar95._12_4_ = uVar35;
            auVar59 = vfmadd213ps_fma(auVar95,auVar82,auVar50);
            auVar83 = vpminsd_avx(auVar90,auVar88);
            auVar55 = vpminsd_avx(auVar66,auVar58);
            auVar83 = vpmaxsd_avx(auVar83,auVar55);
            auVar55 = vpminsd_avx(auVar73,auVar59);
            auVar55 = vpmaxsd_avx(auVar55,auVar53);
            auVar83 = vpmaxsd_avx(auVar83,auVar55);
            auVar55 = vpmaxsd_avx(auVar90,auVar88);
            auVar90 = vpmaxsd_avx(auVar66,auVar58);
            auVar90 = vpminsd_avx(auVar55,auVar90);
            auVar55 = vpmaxsd_avx(auVar73,auVar59);
            auVar55 = vpminsd_avx(auVar55,local_2798);
            auVar55 = vpminsd_avx(auVar90,auVar55);
            auVar83 = vcmpps_avx(auVar83,auVar55,2);
            uVar37 = vmovmskps_avx(auVar83);
            if (uVar37 != 0) {
              uVar14 = *(ulong *)(uVar43 + lVar45 * 8);
              if (uVar42 != 8) {
                *puVar44 = uVar42;
                puVar44[1] = uVar36;
                puVar44 = puVar44 + 2;
              }
              uVar36 = (ulong)(uVar37 & 0xff);
              uVar42 = uVar14;
            }
            auVar89 = ZEXT1664(auVar85);
            uVar39 = uVar39 - 1 & uVar39;
          } while (uVar39 != 0);
          bVar49 = uVar42 != 8;
          uVar43 = uVar42;
        }
      } while (bVar49);
    }
    bVar48 = false;
    puVar38 = puVar44;
    goto LAB_00643e32;
  }
  goto LAB_00643e43;
  while( true ) {
    uVar43 = uVar43 + 1;
    lVar45 = lVar45 + 0xb0;
    auVar73 = auVar88;
    if (uVar36 - 8 <= uVar43) break;
LAB_00643a96:
    uVar42 = 0;
    auVar90 = auVar73;
    while (uVar39 = (ulong)*(uint *)(lVar45 + uVar42 * 4), uVar39 != 0xffffffff) {
      uVar35 = *(undefined4 *)(lVar45 + -0x90 + uVar42 * 4);
      auVar58._4_4_ = uVar35;
      auVar58._0_4_ = uVar35;
      auVar58._8_4_ = uVar35;
      auVar58._12_4_ = uVar35;
      auVar66 = vsubps_avx(auVar58,*(undefined1 (*) [16])ray);
      uVar35 = *(undefined4 *)(lVar45 + -0x80 + uVar42 * 4);
      auVar59._4_4_ = uVar35;
      auVar59._0_4_ = uVar35;
      auVar59._8_4_ = uVar35;
      auVar59._12_4_ = uVar35;
      auVar58 = vsubps_avx(auVar59,*(undefined1 (*) [16])(ray + 0x10));
      uVar35 = *(undefined4 *)(lVar45 + -0x70 + uVar42 * 4);
      auVar60._4_4_ = uVar35;
      auVar60._0_4_ = uVar35;
      auVar60._8_4_ = uVar35;
      auVar60._12_4_ = uVar35;
      auVar59 = vsubps_avx(auVar60,*(undefined1 (*) [16])(ray + 0x20));
      fVar101 = *(float *)(lVar45 + -0x60 + uVar42 * 4);
      local_25f8._4_4_ = fVar101;
      local_25f8._0_4_ = fVar101;
      local_25f8._8_4_ = fVar101;
      local_25f8._12_4_ = fVar101;
      fVar102 = *(float *)(lVar45 + -0x50 + uVar42 * 4);
      local_2608._4_4_ = fVar102;
      local_2608._0_4_ = fVar102;
      local_2608._8_4_ = fVar102;
      local_2608._12_4_ = fVar102;
      fVar1 = *(float *)(lVar45 + -0x40 + uVar42 * 4);
      local_2618._4_4_ = fVar1;
      local_2618._0_4_ = fVar1;
      local_2618._8_4_ = fVar1;
      local_2618._12_4_ = fVar1;
      fVar2 = *(float *)(lVar45 + -0x30 + uVar42 * 4);
      auVar99._4_4_ = fVar2;
      auVar99._0_4_ = fVar2;
      auVar99._8_4_ = fVar2;
      auVar99._12_4_ = fVar2;
      fVar3 = *(float *)(lVar45 + -0x20 + uVar42 * 4);
      local_2568._4_4_ = fVar3;
      local_2568._0_4_ = fVar3;
      local_2568._8_4_ = fVar3;
      local_2568._12_4_ = fVar3;
      fVar4 = *(float *)(lVar45 + -0x10 + uVar42 * 4);
      local_2578._4_4_ = fVar4;
      local_2578._0_4_ = fVar4;
      local_2578._8_4_ = fVar4;
      local_2578._12_4_ = fVar4;
      fVar102 = fVar102 * fVar4;
      auVar61._4_4_ = fVar102;
      auVar61._0_4_ = fVar102;
      auVar61._8_4_ = fVar102;
      auVar61._12_4_ = fVar102;
      auVar61 = vfmsub231ps_fma(auVar61,local_2568,local_2618);
      fVar2 = fVar2 * fVar1;
      auVar97._4_4_ = fVar2;
      auVar97._0_4_ = fVar2;
      auVar97._8_4_ = fVar2;
      auVar97._12_4_ = fVar2;
      local_2648 = vfmsub231ps_fma(auVar97,local_2578,local_25f8);
      fVar3 = fVar3 * fVar101;
      auVar80._4_4_ = fVar3;
      auVar80._0_4_ = fVar3;
      auVar80._8_4_ = fVar3;
      auVar80._12_4_ = fVar3;
      local_2658 = vfmsub231ps_fma(auVar80,auVar99,local_2608);
      auVar62._0_4_ = auVar59._0_4_ * local_2708;
      auVar62._4_4_ = auVar59._4_4_ * fStack_2704;
      auVar62._8_4_ = auVar59._8_4_ * fStack_2700;
      auVar62._12_4_ = auVar59._12_4_ * fStack_26fc;
      local_2588 = vfmsub231ps_fma(auVar62,auVar58,*(undefined1 (*) [16])(ray + 0x60));
      auVar92._0_4_ = (float)local_25c8 * auVar66._0_4_;
      fVar101 = (float)((ulong)local_25c8 >> 0x20);
      auVar92._4_4_ = fVar101 * auVar66._4_4_;
      auVar92._8_4_ = (float)uStack_25c0 * auVar66._8_4_;
      fVar102 = (float)((ulong)uStack_25c0 >> 0x20);
      auVar92._12_4_ = fVar102 * auVar66._12_4_;
      auVar62 = vfmsub231ps_fma(auVar92,auVar59,auVar55);
      auVar87._0_4_ = (float)local_25d8 * auVar58._0_4_;
      auVar87._4_4_ = (float)((ulong)local_25d8 >> 0x20) * auVar58._4_4_;
      auVar87._8_4_ = (float)uStack_25d0 * auVar58._8_4_;
      auVar87._12_4_ = (float)((ulong)uStack_25d0 >> 0x20) * auVar58._12_4_;
      auVar7._12_4_ = fStack_26fc;
      auVar7._0_12_ = *(undefined1 (*) [12])(ray + 0x50);
      local_2628 = vfmsub231ps_fma(auVar87,auVar66,auVar7);
      auVar100._0_4_ = (float)local_25c8 * local_2658._0_4_;
      auVar100._4_4_ = fVar101 * local_2658._4_4_;
      auVar100._8_4_ = (float)uStack_25c0 * local_2658._8_4_;
      auVar100._12_4_ = fVar102 * local_2658._12_4_;
      auVar83 = vfmadd231ps_fma(auVar100,local_2648,auVar7);
      auVar60 = vfmadd231ps_fma(auVar83,auVar55,auVar61);
      auVar93._0_4_ = local_2628._0_4_ * fVar4;
      auVar93._4_4_ = local_2628._4_4_ * fVar4;
      auVar93._8_4_ = local_2628._8_4_ * fVar4;
      auVar93._12_4_ = local_2628._12_4_ * fVar4;
      auVar88 = vfmadd231ps_fma(auVar93,auVar62,local_2568);
      auVar94._8_4_ = 0x80000000;
      auVar94._0_8_ = 0x8000000080000000;
      auVar94._12_4_ = 0x80000000;
      auVar83 = vandps_avx(auVar60,auVar94);
      auVar88 = vfmadd231ps_fma(auVar88,local_2588,auVar99);
      uVar37 = auVar83._0_4_;
      auVar96._0_4_ = auVar88._0_4_ ^ uVar37;
      uVar8 = auVar83._4_4_;
      auVar96._4_4_ = auVar88._4_4_ ^ uVar8;
      uVar9 = auVar83._8_4_;
      auVar96._8_4_ = auVar88._8_4_ ^ uVar9;
      uVar10 = auVar83._12_4_;
      auVar96._12_4_ = auVar88._12_4_ ^ uVar10;
      auVar94 = ZEXT816(0) << 0x20;
      auVar83 = vcmpps_avx(auVar96,auVar94,5);
      auVar7 = auVar90 & auVar83;
      auVar88._8_8_ = mm_lookupmask_ps._8_8_;
      auVar88._0_8_ = mm_lookupmask_ps._0_8_;
      if ((((auVar7 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar7 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar7 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar7[0xf] < '\0')
      {
        auVar83 = vandps_avx(auVar83,auVar90);
        auVar64._0_4_ = local_2628._0_4_ * fVar1;
        auVar64._4_4_ = local_2628._4_4_ * fVar1;
        auVar64._8_4_ = local_2628._8_4_ * fVar1;
        auVar64._12_4_ = local_2628._12_4_ * fVar1;
        auVar88 = vfmadd132ps_fma(auVar62,auVar64,local_2608);
        auVar88 = vfmadd132ps_fma(local_2588,auVar88,local_25f8);
        auVar98._0_4_ = auVar88._0_4_ ^ uVar37;
        auVar98._4_4_ = auVar88._4_4_ ^ uVar8;
        auVar98._8_4_ = auVar88._8_4_ ^ uVar9;
        auVar98._12_4_ = auVar88._12_4_ ^ uVar10;
        auVar7 = vcmpps_avx(auVar98,auVar94,5);
        auVar62 = auVar83 & auVar7;
        if ((((auVar62 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar62 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar62 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar62[0xf] < '\0') {
          auVar62 = vandps_avx(auVar60,local_26e8);
          auVar83 = vandps_avx(auVar7,auVar83);
          auVar88 = vsubps_avx(auVar62,auVar96);
          auVar7 = vcmpps_avx(auVar88,auVar98,5);
          auVar80 = auVar83 & auVar7;
          if ((((auVar80 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar80 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar80 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar80[0xf] < '\0') {
            auVar83 = vandps_avx(auVar7,auVar83);
            auVar74._0_4_ = local_2658._0_4_ * auVar59._0_4_;
            auVar74._4_4_ = local_2658._4_4_ * auVar59._4_4_;
            auVar74._8_4_ = local_2658._8_4_ * auVar59._8_4_;
            auVar74._12_4_ = local_2658._12_4_ * auVar59._12_4_;
            auVar88 = vfmadd132ps_fma(auVar58,auVar74,local_2648);
            auVar66 = vfmadd132ps_fma(auVar66,auVar88,auVar61);
            auVar75._0_4_ = auVar66._0_4_ ^ uVar37;
            auVar75._4_4_ = auVar66._4_4_ ^ uVar8;
            auVar75._8_4_ = auVar66._8_4_ ^ uVar9;
            auVar75._12_4_ = auVar66._12_4_ ^ uVar10;
            local_26b8._0_4_ = (float)uVar18;
            local_26b8._4_4_ = (float)((ulong)uVar18 >> 0x20);
            uStack_26b0._0_4_ = (float)uVar19;
            uStack_26b0._4_4_ = (float)((ulong)uVar19 >> 0x20);
            auVar81._0_4_ = auVar62._0_4_ * (float)local_26b8;
            auVar81._4_4_ = auVar62._4_4_ * local_26b8._4_4_;
            auVar81._8_4_ = auVar62._8_4_ * (float)uStack_26b0;
            auVar81._12_4_ = auVar62._12_4_ * uStack_26b0._4_4_;
            auVar66 = vcmpps_avx(auVar81,auVar75,1);
            local_26c8._0_4_ = (float)uVar20;
            local_26c8._4_4_ = (float)((ulong)uVar20 >> 0x20);
            uStack_26c0._0_4_ = (float)uVar21;
            uStack_26c0._4_4_ = (float)((ulong)uVar21 >> 0x20);
            auVar65._0_4_ = auVar62._0_4_ * (float)local_26c8;
            auVar65._4_4_ = auVar62._4_4_ * local_26c8._4_4_;
            auVar65._8_4_ = auVar62._8_4_ * (float)uStack_26c0;
            auVar65._12_4_ = auVar62._12_4_ * uStack_26c0._4_4_;
            auVar88 = vcmpps_avx(auVar75,auVar65,2);
            auVar66 = vandps_avx(auVar88,auVar66);
            auVar58 = auVar83 & auVar66;
            if ((((auVar58 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar58 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar58 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar58[0xf] < '\0') {
              auVar83 = vandps_avx(auVar83,auVar66);
              auVar66 = vcmpps_avx(auVar60,auVar94,4);
              auVar88 = auVar83 & auVar66;
              if ((((auVar88 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar88 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar88 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar88[0xf]) {
              }
              else {
                auVar88 = vandps_avx(auVar66,auVar83);
              }
            }
          }
        }
      }
      uVar37 = ((context->scene->geometries).items[uVar39].ptr)->mask;
      auVar63._4_4_ = uVar37;
      auVar63._0_4_ = uVar37;
      auVar63._8_4_ = uVar37;
      auVar63._12_4_ = uVar37;
      auVar83 = vpand_avx(auVar63,*(undefined1 (*) [16])(ray + 0x90));
      auVar83 = vpcmpeqd_avx(auVar94,auVar83);
      auVar66 = auVar88 & ~auVar83;
      if ((((auVar66 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar66 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar66 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar66[0xf] < '\0'
         ) {
        auVar83 = vandnps_avx(auVar83,auVar88);
        auVar90 = vandnps_avx(auVar83,auVar90);
      }
      auVar89 = ZEXT1664(auVar85);
      if (((((auVar90 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar90 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar90 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar90[0xf])
         || (bVar49 = 2 < uVar42, uVar42 = uVar42 + 1, bVar49)) break;
    }
    auVar83 = auVar89._0_16_;
    auVar88 = vandps_avx(auVar90,auVar73);
    auVar90 = auVar90 & auVar73;
    if ((((auVar90 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar90 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar90 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar90[0xf])
    break;
  }
  auVar66._0_8_ = auVar88._0_8_ ^ 0xffffffffffffffff;
  auVar66._8_4_ = auVar88._8_4_ ^ 0xffffffff;
  auVar66._12_4_ = auVar88._12_4_ ^ 0xffffffff;
LAB_00643df6:
  auVar83 = vorps_avx(auVar83,auVar66);
  auVar89 = ZEXT1664(auVar83);
  auVar85 = vandnps_avx(auVar83,local_27a8);
  local_27a8 = local_27a8 & ~auVar83;
  bVar16 = (local_27a8 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar17 = (local_27a8 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar15 = (local_27a8 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
  bVar49 = -1 < local_27a8[0xf];
  bVar48 = ((bVar16 && bVar17) && bVar15) && bVar49;
  puVar38 = puVar44;
  local_27a8 = auVar85;
  if (((!bVar16 || !bVar17) || !bVar15) || !bVar49) {
    auVar76._8_4_ = 0xff800000;
    auVar76._0_8_ = 0xff800000ff800000;
    auVar76._12_4_ = 0xff800000;
    local_2798 = vblendvps_avx(local_2798,auVar76,auVar83);
  }
LAB_00643e32:
  if (bVar48) goto LAB_00643e43;
  goto LAB_006437c0;
LAB_00643e43:
  if (uVar41 == 0) {
    auVar50 = vpcmpeqd_avx(auVar50,auVar50);
    auVar50 = vpcmpeqd_avx(auVar50,(undefined1  [16])local_26d8);
    auVar50 = vpand_avx(auVar50,auVar89._0_16_);
    auVar67._8_4_ = 0xff800000;
    auVar67._0_8_ = 0xff800000ff800000;
    auVar67._12_4_ = 0xff800000;
    auVar50 = vmaskmovps_avx(auVar50,auVar67);
    *(undefined1 (*) [16])(ray + 0x80) = auVar50;
    return;
  }
  goto LAB_006433a2;
}

Assistant:

__forceinline vboolf4 operator ==(const vint4& a, const vint4& b) { return _mm_castsi128_ps(_mm_cmpeq_epi32(a, b)); }